

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O1

void __thiscall QPushButton::keyPressEvent(QPushButton *this,QKeyEvent *e)

{
  QPushButtonPrivate *this_00;
  byte bVar1;
  QDialog *pQVar2;
  QPushButtonPrivate *d;
  bool bVar3;
  
  if ((*(uint *)(e + 0x40) & 0xfffffffe) == 0x1000004) {
    this_00 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
    bVar1 = this_00->field_0x2c8 & 3;
    if (bVar1 == 2) {
      pQVar2 = QPushButtonPrivate::dialogParent(this_00);
      bVar3 = pQVar2 == (QDialog *)0x0;
    }
    else {
      bVar3 = bVar1 == 0;
    }
    if ((!bVar3) || ((this_00->field_0x2c8 & 4) != 0)) {
      QAbstractButton::click(&this->super_QAbstractButton);
      return;
    }
  }
  QAbstractButton::keyPressEvent(&this->super_QAbstractButton,e);
  return;
}

Assistant:

void QPushButton::keyPressEvent(QKeyEvent *e)
{
    Q_D(QPushButton);
    switch (e->key()) {
    case Qt::Key_Enter:
    case Qt::Key_Return:
        if (autoDefault() || d->defaultButton) {
            click();
            break;
        }
        Q_FALLTHROUGH();
    default:
        QAbstractButton::keyPressEvent(e);
    }
}